

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O0

undefined8 duckdb::ISOYearFun::GetFunctions(void)

{
  undefined8 in_RDI;
  
  GetDatePartFunction<duckdb::DatePart::ISOYearOperator>();
  return in_RDI;
}

Assistant:

ScalarFunctionSet ISOYearFun::GetFunctions() {
	return GetDatePartFunction<DatePart::ISOYearOperator>();
}